

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# book.cpp
# Opt level: O0

void decompress(char *buffer_out)

{
  int iVar1;
  long lVar2;
  char *in_RDI;
  bool bVar3;
  int c_1;
  int matchLength;
  int ago_p;
  int c;
  int literalLength;
  int token;
  int und_end;
  int und_p;
  int i;
  int p;
  int blockLength;
  int local_30;
  int local_2c;
  uint local_28;
  int local_24;
  uint local_20;
  int local_1c;
  int local_18;
  int local_14;
  int local_10;
  int local_c;
  char *local_8;
  
  local_c = 0;
  local_10 = 0;
  local_14 = 0;
  local_8 = in_RDI;
LAB_00107781:
  if (1 < local_14) {
    return;
  }
  local_18 = (local_14 + 1) * 4 + local_c;
  local_c = *(int *)(data + (local_14 * 4 + local_c));
  local_1c = local_18 + local_c;
LAB_001077c6:
  iVar1 = local_18 + 1;
  local_20 = (uint)data[local_18];
  local_18 = iVar1;
  if (0xf < local_20) {
    local_24 = (int)local_20 >> 4;
    if (local_24 == 0xf) {
      local_24 = 0xf;
      do {
        iVar1 = local_18 + 1;
        local_28 = (uint)data[local_18];
        local_24 = local_28 + local_24;
        local_18 = iVar1;
      } while (local_28 == 0xff);
    }
    copyToDestination(local_8,&local_10,data,&local_18,&local_24);
    local_10 = local_24 + local_10;
    local_18 = local_24 + local_18;
    if (local_1c <= local_18) goto LAB_00107987;
  }
  local_2c = local_10 - (uint)*(ushort *)(data + local_18);
  local_18 = local_18 + 2;
  local_30 = (local_20 & 0xf) + 4;
  if (local_30 == 0x13) {
    local_30 = 0x13;
    do {
      iVar1 = local_18 + 1;
      lVar2 = (long)local_18;
      local_30 = (uint)data[lVar2] + local_30;
      local_18 = iVar1;
    } while (data[lVar2] == 0xff);
  }
  if (local_10 - local_2c < 4) {
    while (iVar1 = local_30 + -1, bVar3 = local_30 != 0, local_30 = iVar1, bVar3) {
      local_8[local_10] = local_8[local_2c];
      local_2c = local_2c + 1;
      local_10 = local_10 + 1;
    }
  }
  else {
    copyToDestination(local_8,&local_10,(uchar *)local_8,&local_2c,&local_30);
    local_10 = local_30 + local_10;
  }
  goto LAB_001077c6;
LAB_00107987:
  local_14 = local_14 + 1;
  goto LAB_00107781;
}

Assistant:

void decompress(char* buffer_out) {
	int blockLength = 0;
    int p = 0;                                  //指向当前输出缓冲区的位置
	for(int i = 0; i < 2; i++) {
        int und_p = 4 * (i + 1) + blockLength;  //指向当前待解压区的位置
        blockLength = *((unsigned int*) (&data[4 * i + blockLength]));
		int und_end = und_p + blockLength;	    //待解压区的结束位置

		while (1) {
			int token = data[und_p++];

			//如果token中字面值长度是有的
			if (token >= 16) {
				int literalLength = token >> 4;    //字面值长度

				if (literalLength == 15) {
					//字面值长度大于等于15就接着去扩展区获取
					while (1) {
						int c = data[und_p++];
						literalLength += c;

						if (c != 255)
							break;
					}
				}

				//复制字面的字符
				copyToDestination(buffer_out, p, data, und_p, literalLength);

				//挪动当前位置指向和待压缩区位置指向
				p += literalLength;
				und_p += literalLength;

				//如果复制完字面字符已经到底了就退出
				if (und_p >= und_end)
					break;
			}

			//获取匹配字符串在的位置
			int ago_p = p - (*((unsigned short*)(&data[und_p])));
			und_p += 2;

			//获取token里的匹配长度
			int matchLength = (token & 15) + 4;

			if (matchLength == 15 + 4) {
				//如果有扩展长度就获取扩展的匹配长度
				while (1) {
					int c = data[und_p++];
					matchLength += c;

					if (c != 255)
						break;
				}
			}

			//偏移大于等于4可以大胆整块复制
			if (p - ago_p >= 4) {
				copyToDestination(buffer_out, p, (unsigned char*) buffer_out, ago_p, matchLength);
				p += matchLength;
			}
			else {
				//否则一个个字符复制
				while (matchLength-- != 0)
					buffer_out[p++] = buffer_out[ago_p++];
			}
		}
	}
}